

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::coalesce<signed_char>
          (Omega_h *this,
          vector<Omega_h::Read<signed_char>,_std::allocator<Omega_h::Read<signed_char>_>_> *arrays)

{
  value_type vVar1;
  undefined8 *puVar2;
  ulong uVar3;
  void *in_RDX;
  ulong *puVar4;
  void *extraout_RDX;
  ulong uVar5;
  int iVar6;
  LO LVar7;
  long lVar8;
  Read<signed_char> RVar9;
  Write<signed_char> out;
  Write<signed_char> local_90;
  value_type array;
  type f;
  vector<int,_std::allocator<int>_> offsets;
  
  if (*(long *)arrays == *(long *)(arrays + 8)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              (&offsets,(*(long *)(arrays + 8) - *(long *)arrays >> 4) + 1,(allocator_type *)&f);
    if (offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      fail("assertion %s failed at %s +%d\n","offsets.data() != nullptr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x1c2);
    }
    *offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    puVar4 = *(ulong **)arrays;
    uVar3 = *(long *)(arrays + 8) - (long)puVar4 >> 4;
    for (uVar5 = 1; puVar4 = puVar4 + 2, uVar5 <= uVar3; uVar5 = uVar5 + 1) {
      puVar2 = (undefined8 *)*puVar4;
      if (((ulong)puVar2 & 1) == 0) {
        iVar6 = (int)*puVar2;
      }
      else {
        iVar6 = (int)((ulong)puVar2 >> 3);
      }
      offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = iVar6 + offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5 - 1];
    }
    LVar7 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar3];
    std::__cxx11::string::string((string *)&f,"",(allocator *)&array);
    Write<signed_char>::Write(&out,LVar7,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    lVar8 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(*(long *)(arrays + 8) - *(long *)arrays >> 4); uVar5 = uVar5 + 1
        ) {
      Write<signed_char>::Write(&array.write_,(Write<signed_char> *)(*(long *)arrays + lVar8));
      vVar1 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      Write<signed_char>::Write(&f.out,&out);
      f.offset = vVar1;
      Write<signed_char>::Write(&f.array.write_,&array.write_);
      if (((ulong)array.write_.shared_alloc_.alloc & 1) == 0) {
        LVar7 = (LO)(array.write_.shared_alloc_.alloc)->size;
      }
      else {
        LVar7 = (LO)((ulong)array.write_.shared_alloc_.alloc >> 3);
      }
      parallel_for<Omega_h::coalesce<signed_char>(std::vector<Omega_h::Read<signed_char>,std::allocator<Omega_h::Read<signed_char>>>)::_lambda(int)_1_>
                (LVar7,&f,"coalesce");
      coalesce<signed_char>(std::vector<Omega_h::Read<signed_char>,std::allocator<Omega_h::Read<signed_char>>>)
      ::{lambda(int)#1}::~vector((_lambda_int__1_ *)&f);
      Write<signed_char>::~Write(&array.write_);
      lVar8 = lVar8 + 0x10;
    }
    Write<signed_char>::Write(&local_90,&out);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_90);
    Write<signed_char>::~Write(&local_90);
    Write<signed_char>::~Write(&out);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&offsets.super__Vector_base<int,_std::allocator<int>_>);
    in_RDX = extraout_RDX;
  }
  RVar9.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<T> coalesce(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  std::vector<LO> offsets(arrays.size() + 1);
  OMEGA_H_CHECK(offsets.data() != nullptr);
  offsets[0] = 0;
  for (std::size_t i = 1; i <= arrays.size(); ++i) {
    offsets[i] = offsets[i - 1] + arrays[i].size();
  }
  auto out_size = offsets[arrays.size()];
  auto out = Write<T>(out_size);
  for (std::size_t i = 0; i < arrays.size(); ++i) {
    auto array = arrays[std::size_t(i)];
    auto offset = offsets[i];
    auto f = OMEGA_H_LAMBDA(LO j) { out[offset + j] = array[j]; };
    parallel_for(array.size(), f, "coalesce");
  }
  return out;
}